

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageChannel.cpp
# Opt level: O0

void __thiscall Imf_3_4::ImageChannel::resize(ImageChannel *this)

{
  int iVar1;
  int iVar2;
  ImageLevel *this_00;
  Box2i *pBVar3;
  ArgExc *pAVar4;
  ImageChannel *in_RDI;
  int height;
  int width;
  Box2i *dataWindow;
  
  this_00 = level(in_RDI);
  pBVar3 = ImageLevel::dataWindow(this_00);
  if ((pBVar3->min).x % in_RDI->_xSampling == 0) {
    if ((pBVar3->min).y % in_RDI->_ySampling == 0) {
      iVar1 = ((pBVar3->max).x - (pBVar3->min).x) + 1;
      iVar2 = ((pBVar3->max).y - (pBVar3->min).y) + 1;
      if (iVar1 % in_RDI->_xSampling == 0) {
        if (iVar2 % in_RDI->_ySampling == 0) {
          in_RDI->_pixelsPerRow = iVar1 / in_RDI->_xSampling;
          in_RDI->_pixelsPerColumn = iVar2 / in_RDI->_ySampling;
          in_RDI->_numPixels = (long)(in_RDI->_pixelsPerRow * in_RDI->_pixelsPerColumn);
          return;
        }
      }
      pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar4,
                 "The width and height of the data window of an image level must be multiples of the x and y subsampling factors of all channels in the image."
                );
      __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (pAVar4,
             "The minimum x and y coordinates of the data window of an image level must be multiples of the x and y subsampling factors of all channels in the image."
            );
  __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
ImageChannel::resize ()
{
    const Box2i& dataWindow = level ().dataWindow ();

    if (dataWindow.min.x % _xSampling || dataWindow.min.y % _ySampling)
    {
        throw ArgExc ("The minimum x and y coordinates of the data window "
                      "of an image level must be multiples of the x and y "
                      "subsampling factors of all channels in the image.");
    }

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    if (width % _xSampling || height % _ySampling)
    {
        throw ArgExc ("The width and height of the data window of an image "
                      "level must be multiples of the x and y subsampling "
                      "factors of all channels in the image.");
    }

    _pixelsPerRow    = width / _xSampling;
    _pixelsPerColumn = height / _ySampling;
    _numPixels       = _pixelsPerRow * _pixelsPerColumn;
}